

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

tuple<absl::CommandLineFlag_*,_bool>
absl::flags_internal::anon_unknown_0::LocateFlag(string_view flag_name)

{
  bool bVar1;
  char *in_RCX;
  char *in_RDX;
  CommandLineFlag **__args;
  tuple<absl::CommandLineFlag_*,_bool> tVar2;
  string_view name;
  string_view name_00;
  string_view expected;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_39;
  absl *paStack_38;
  bool is_negative;
  CommandLineFlag *local_28;
  CommandLineFlag *flag;
  string_view flag_name_local;
  char *extraout_RDX;
  
  paStack_38 = (absl *)flag_name._M_str;
  __args = (CommandLineFlag **)flag_name._M_len;
  name._M_str = in_RDX;
  name._M_len = (size_t)in_RDX;
  flag = (CommandLineFlag *)paStack_38;
  flag_name_local._M_len = (size_t)in_RDX;
  flag_name_local._M_str = (char *)__args;
  local_28 = FindCommandLineFlag(paStack_38,name);
  local_39 = 0;
  if (local_28 == (CommandLineFlag *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"no");
    expected._M_str = in_RCX;
    expected._M_len = (size_t)local_50._M_str;
    bVar1 = ConsumePrefix((absl *)&flag,(Nonnull<absl::string_view_*>)local_50._M_len,expected);
    if (bVar1) {
      name_00._M_str = extraout_RDX;
      name_00._M_len = flag_name_local._M_len;
      local_28 = FindCommandLineFlag((absl *)flag,name_00);
      local_39 = 1;
    }
  }
  tVar2 = std::make_tuple<absl::CommandLineFlag*&,bool&>(__args,(bool *)&local_28);
  tVar2.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>._0_8_ = __args;
  return (tuple<absl::CommandLineFlag_*,_bool>)
         tVar2.super__Tuple_impl<0UL,_absl::CommandLineFlag_*,_bool>;
}

Assistant:

std::tuple<CommandLineFlag*, bool> LocateFlag(absl::string_view flag_name) {
  CommandLineFlag* flag = absl::FindCommandLineFlag(flag_name);
  bool is_negative = false;

  if (!flag && absl::ConsumePrefix(&flag_name, "no")) {
    flag = absl::FindCommandLineFlag(flag_name);
    is_negative = true;
  }

  return std::make_tuple(flag, is_negative);
}